

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# MidiFile.cpp
# Opt level: O0

string * __thiscall
smf::MidiFile::getBase64_abi_cxx11_(string *__return_storage_ptr__,MidiFile *this,int width)

{
  allocator local_1bd [20];
  undefined1 local_1a9;
  stringstream local_1a8 [7];
  bool status;
  stringstream output;
  ostream local_198 [380];
  int local_1c;
  MidiFile *pMStack_18;
  int width_local;
  MidiFile *this_local;
  
  local_1c = width;
  pMStack_18 = this;
  this_local = (MidiFile *)__return_storage_ptr__;
  std::__cxx11::stringstream::stringstream(local_1a8);
  local_1a9 = writeBase64(this,local_198,local_1c);
  if ((bool)local_1a9) {
    std::__cxx11::stringstream::str();
  }
  else {
    std::allocator<char>::allocator();
    std::__cxx11::string::string((string *)__return_storage_ptr__,"",local_1bd);
    std::allocator<char>::~allocator((allocator<char> *)local_1bd);
  }
  std::__cxx11::stringstream::~stringstream(local_1a8);
  return __return_storage_ptr__;
}

Assistant:

std::string MidiFile::getBase64(int width) {
	std::stringstream output;
	bool status = MidiFile::writeBase64(output, width);
	if (!status) {
		return "";
	} else {
		return output.str();
	}
}